

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeTree.cpp
# Opt level: O1

void __thiscall
Indexing::CodeTree::Compiler<false>::handleVar
          (Compiler<false> *this,uint var,Stack<unsigned_int> *globalCounterparts)

{
  CodeOp **ppCVar1;
  uint uVar2;
  CodeOp *pCVar3;
  bool bVar4;
  uint *in_RAX;
  CodeStack *this_00;
  uint64_t uVar5;
  uint *varNumPtr;
  uint *local_18;
  
  local_18 = in_RAX;
  bVar4 = ::Lib::DHMap<unsigned_int,_unsigned_int,_Lib::DefaultHash,_Lib::DefaultHash2>::getValuePtr
                    (&this->varMap,var,&local_18);
  if (bVar4) {
    uVar2 = this->nextVarNum;
    this->nextVarNum = uVar2 + 1;
    *local_18 = uVar2;
    this_00 = this->code;
    uVar5 = (ulong)uVar2 * 8 + 4;
  }
  else {
    this_00 = this->code;
    uVar5 = (ulong)*local_18 * 8 + 5;
  }
  ppCVar1 = &this_00->_cursor;
  if (this_00->_cursor == this_00->_end) {
    ::Lib::Stack<Indexing::CodeTree::CodeOp>::expand(this_00);
  }
  pCVar3 = *ppCVar1;
  pCVar3->_content = uVar5;
  pCVar3->_alternative = (CodeOp *)0x0;
  *ppCVar1 = *ppCVar1 + 1;
  return;
}

Assistant:

void CodeTree::Compiler<forLits>::handleVar(unsigned var, Stack<unsigned>* globalCounterparts)
{
  unsigned* varNumPtr;
  if (varMap.getValuePtr(var,varNumPtr)) {
    *varNumPtr = nextVarNum++;
    code.push(CodeOp::getTermOp(ASSIGN_VAR, *varNumPtr));

    if constexpr (forLits) {
      unsigned* globalVarNumPtr;
      if (globalVarMap.getValuePtr(var,globalVarNumPtr)) {
        *globalVarNumPtr = nextGlobalVarNum++;
      }
      globalCounterparts->push(*globalVarNumPtr);
    }
  } else {
    code.push(CodeOp::getTermOp(CHECK_VAR, *varNumPtr));
  }
}